

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcolordialog.cpp
# Opt level: O2

void __thiscall QtPrivate::QColorShowLabel::dropEvent(QColorShowLabel *this,QDropEvent *e)

{
  QRgb _t1;
  long in_FS_OFFSET;
  QDropEvent QVar1;
  QColor QVar2;
  QVariant local_50;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  QMimeData::colorData();
  QVar2 = qvariant_cast<QColor>(&local_50);
  ::QVariant::~QVariant(&local_50);
  QVar1 = (QDropEvent)(QVar2.cspec != Invalid);
  if ((bool)QVar1) {
    *(long *)&this->col = QVar2._0_8_;
    *(int *)((long)&(this->col).ct + 4) = QVar2.ct._4_4_;
    (this->col).ct.argb.pad = QVar2.ct._8_2_;
    QWidget::repaint((QWidget *)this);
    _t1 = QColor::rgb();
    colorDropped(this,_t1);
  }
  e[0xc] = QVar1;
  if (*(long *)(in_FS_OFFSET + 0x28) != local_30) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QColorShowLabel::dropEvent(QDropEvent *e)
{
    QColor color = qvariant_cast<QColor>(e->mimeData()->colorData());
    if (color.isValid()) {
        col = color;
        repaint();
        emit colorDropped(col.rgb());
        e->accept();
    } else {
        e->ignore();
    }
}